

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::writeTestCase(JunitReporter *this,TestCaseNode *testCaseNode)

{
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  const_reference this_00;
  SectionNode *sectionNode;
  allocator local_79;
  string local_78 [48];
  string local_48 [8];
  string className;
  SectionNode *rootSection;
  TestCaseStats *stats;
  TestCaseNode *testCaseNode_local;
  JunitReporter *this_local;
  
  sVar3 = std::
          vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
          ::size(&testCaseNode->children);
  if (sVar3 != 1) {
    __assert_fail("testCaseNode.children.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nopppers[P]03-lambda-stuff/lib/catch.hpp"
                  ,0x24de,"void Catch::JunitReporter::writeTestCase(const TestCaseNode &)");
  }
  this_00 = std::
            vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
            ::front(&testCaseNode->children);
  sectionNode = Ptr<Catch::CumulativeReporterBase::SectionNode>::operator*(this_00);
  std::__cxx11::string::string(local_48,(string *)&(testCaseNode->value).testInfo.className);
  bVar1 = std::__cxx11::string::empty();
  if (((bVar1 & 1) != 0) &&
     (bVar2 = std::
              vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
              ::empty(&sectionNode->childSections), bVar2)) {
    std::__cxx11::string::operator=(local_48,"global");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"",&local_79);
  writeSection(this,(string *)local_48,(string *)local_78,sectionNode);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void writeTestCase( TestCaseNode const& testCaseNode ) {
            TestCaseStats const& stats = testCaseNode.value;

            // All test cases have exactly one section - which represents the
            // test case itself. That section may have 0-n nested sections
            assert( testCaseNode.children.size() == 1 );
            SectionNode const& rootSection = *testCaseNode.children.front();

            std::string className = stats.testInfo.className;

            if( className.empty() ) {
                if( rootSection.childSections.empty() )
                    className = "global";
            }
            writeSection( className, "", rootSection );
        }